

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::OneofDescriptorProto::MergeFrom
          (OneofDescriptorProto *this,OneofDescriptorProto *from)

{
  uint uVar1;
  OneofDescriptorProto *pOVar2;
  LogMessage *other;
  uint32_t *puVar3;
  Arena *pAVar4;
  OneofOptions *this_00;
  OneofOptions *from_00;
  LogFinisher local_75;
  uint32_t cached_has_bits;
  byte local_61;
  LogMessage local_60;
  OneofDescriptorProto *local_28;
  OneofDescriptorProto *from_local;
  OneofDescriptorProto *this_local;
  OneofDescriptorProto *local_10;
  
  local_61 = 0;
  local_28 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x10e3);
    local_61 = 1;
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_75,other);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  puVar3 = internal::HasBits<1UL>::operator[](&local_28->_has_bits_,0);
  uVar1 = *puVar3;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      this_local = (OneofDescriptorProto *)_internal_name_abi_cxx11_(local_28);
      local_10 = this;
      puVar3 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
      pOVar2 = this_local;
      *puVar3 = *puVar3 | 1;
      pAVar4 = MessageLite::GetArenaForAllocation((MessageLite *)this);
      internal::ArenaStringPtr::Set(&this->name_,pOVar2,pAVar4);
    }
    if ((uVar1 & 2) != 0) {
      this_00 = _internal_mutable_options(this);
      from_00 = _internal_options(local_28);
      OneofOptions::MergeFrom(this_00,from_00);
    }
  }
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,
             &(local_28->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

void OneofDescriptorProto::MergeFrom(const OneofDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.OneofDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_options()->::PROTOBUF_NAMESPACE_ID::OneofOptions::MergeFrom(from._internal_options());
    }
  }
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
}